

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

int fy_emit_document_start(fy_emitter *emit,fy_document *fyd,fy_node *fyn_root)

{
  fy_anchor *pfVar1;
  bool local_4a;
  _Bool local_49;
  fy_node *local_48;
  int ret;
  _Bool root_tag_or_anchor;
  fy_node *root;
  fy_node *fyn_root_local;
  fy_document *fyd_local;
  fy_emitter *emit_local;
  
  if (((emit == (fy_emitter *)0x0) || (fyd == (fy_document *)0x0)) ||
     (fyd->fyds == (fy_document_state *)0x0)) {
    emit_local._4_4_ = -1;
  }
  else {
    local_48 = fyn_root;
    if (fyn_root == (fy_node *)0x0) {
      local_48 = fy_document_root(fyd);
    }
    local_49 = false;
    if (local_48 != (fy_node *)0x0) {
      local_4a = true;
      if (local_48->tag == (fy_token *)0x0) {
        pfVar1 = fy_document_lookup_anchor_by_node(fyd,local_48);
        local_4a = pfVar1 != (fy_anchor *)0x0;
      }
      local_49 = local_4a;
    }
    emit_local._4_4_ = fy_emit_common_document_start(emit,fyd->fyds,local_49);
    if (emit_local._4_4_ == 0) {
      emit->fyd = fyd;
      emit_local._4_4_ = 0;
    }
  }
  return emit_local._4_4_;
}

Assistant:

int fy_emit_document_start(struct fy_emitter *emit, struct fy_document *fyd,
                           struct fy_node *fyn_root) {
    struct fy_node *root;
    bool root_tag_or_anchor;
    int ret;

    if (!emit || !fyd || !fyd->fyds)
        return -1;

    root = fyn_root ?: fy_document_root(fyd);

    root_tag_or_anchor = root && (root->tag || fy_document_lookup_anchor_by_node(fyd, root));

    ret = fy_emit_common_document_start(emit, fyd->fyds, root_tag_or_anchor);
    if (ret)
        return ret;

    emit->fyd = fyd;

    return 0;
}